

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

void __thiscall vkb::SwapchainBuilder::SwapchainBuilder(SwapchainBuilder *this,Device *device)

{
  VkPhysicalDevice phys_device;
  VkSurfaceKHR surface;
  uint32_t uVar1;
  uint32_t uVar2;
  pointer pVVar3;
  uint uVar4;
  ulong uVar5;
  
  *(undefined8 *)
   ((long)&(this->info).pNext_chain.
           super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->info).pNext_chain.
           super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).physical_device = (VkPhysicalDevice)0x0;
  (this->info).device = (VkDevice)0x0;
  (this->info).surface = (VkSurfaceKHR)0x0;
  (this->info).desired_formats.
  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).desired_formats.
  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).desired_formats.
  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).instance_version = 0x400000;
  (this->info).desired_width = 0x100;
  (this->info).desired_height = 0x100;
  (this->info).array_layer_count = 1;
  (this->info).min_image_count = 0;
  (this->info).required_min_image_count = 0;
  (this->info).image_usage_flags = 0x10;
  (this->info).graphics_queue_index = 0;
  (this->info).present_queue_index = 0;
  (this->info).pre_transform = 0;
  (this->info).composite_alpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
  (this->info).desired_present_modes.
  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).desired_present_modes.
  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).desired_present_modes.
  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).clipped = true;
  (this->info).old_swapchain = (VkSwapchainKHR)0x0;
  (this->info).allocation_callbacks = (VkAllocationCallbacks *)0x0;
  phys_device = (device->physical_device).physical_device;
  (this->info).physical_device = phys_device;
  (this->info).device = device->device;
  surface = device->surface;
  (this->info).surface = surface;
  (this->info).instance_version = device->instance_version;
  uVar1 = detail::get_present_queue_index(phys_device,surface,&device->queue_families);
  pVVar3 = (device->queue_families).
           super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (int)((ulong)((long)(device->queue_families).
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3) >> 3) *
          -0x55555555;
  uVar2 = 0xffffffff;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      if ((pVVar3->queueFlags & 1) != 0) {
        uVar2 = (uint32_t)uVar5;
        break;
      }
      uVar5 = uVar5 + 1;
      pVVar3 = pVVar3 + 1;
    } while (uVar4 != uVar5);
  }
  if ((uVar1 != 0xffffffff) && (uVar2 != 0xffffffff)) {
    (this->info).graphics_queue_index = uVar1;
    (this->info).present_queue_index = uVar2;
    return;
  }
  __assert_fail("graphics.has_value() && present.has_value() && \"Graphics and Present queue indexes must be valid\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                ,0x74a,"vkb::SwapchainBuilder::SwapchainBuilder(const Device &)");
}

Assistant:

SwapchainBuilder::SwapchainBuilder(Device const& device) {
    info.physical_device = device.physical_device.physical_device;
    info.device = device.device;
    info.surface = device.surface;
    info.instance_version = device.instance_version;
    auto present = device.get_queue_index(QueueType::present);
    auto graphics = device.get_queue_index(QueueType::graphics);
    assert(graphics.has_value() && present.has_value() && "Graphics and Present queue indexes must be valid");
    info.graphics_queue_index = present.value();
    info.present_queue_index = graphics.value();
}